

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

UnconditionalBranchDirectiveSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::UnconditionalBranchDirectiveSyntax,slang::syntax::UnconditionalBranchDirectiveSyntax_const&>
          (BumpAllocator *this,UnconditionalBranchDirectiveSyntax *args)

{
  SyntaxNode *pSVar1;
  SyntaxNode *pSVar2;
  size_t sVar3;
  undefined4 uVar4;
  TokenKind TVar5;
  undefined1 uVar6;
  NumericTokenFlags NVar7;
  uint32_t uVar8;
  UnconditionalBranchDirectiveSyntax *pUVar9;
  
  pUVar9 = (UnconditionalBranchDirectiveSyntax *)allocate(this,0x60,8);
  uVar4 = *(undefined4 *)&(args->super_DirectiveSyntax).super_SyntaxNode.field_0x4;
  pSVar1 = (args->super_DirectiveSyntax).super_SyntaxNode.parent;
  pSVar2 = (args->super_DirectiveSyntax).super_SyntaxNode.previewNode;
  TVar5 = (args->super_DirectiveSyntax).directive.kind;
  uVar6 = (args->super_DirectiveSyntax).directive.field_0x2;
  NVar7.raw = (args->super_DirectiveSyntax).directive.numFlags.raw;
  uVar8 = (args->super_DirectiveSyntax).directive.rawLen;
  (pUVar9->super_DirectiveSyntax).super_SyntaxNode.kind =
       (args->super_DirectiveSyntax).super_SyntaxNode.kind;
  *(undefined4 *)&(pUVar9->super_DirectiveSyntax).super_SyntaxNode.field_0x4 = uVar4;
  (pUVar9->super_DirectiveSyntax).super_SyntaxNode.parent = pSVar1;
  (pUVar9->super_DirectiveSyntax).super_SyntaxNode.previewNode = pSVar2;
  (pUVar9->super_DirectiveSyntax).directive.kind = TVar5;
  (pUVar9->super_DirectiveSyntax).directive.field_0x2 = uVar6;
  (pUVar9->super_DirectiveSyntax).directive.numFlags = (NumericTokenFlags)NVar7.raw;
  (pUVar9->super_DirectiveSyntax).directive.rawLen = uVar8;
  (pUVar9->super_DirectiveSyntax).directive.info = (args->super_DirectiveSyntax).directive.info;
  uVar4 = *(undefined4 *)&(args->disabledTokens).super_SyntaxListBase.super_SyntaxNode.field_0x4;
  pSVar1 = (args->disabledTokens).super_SyntaxListBase.super_SyntaxNode.parent;
  (pUVar9->disabledTokens).super_SyntaxListBase.super_SyntaxNode.kind =
       (args->disabledTokens).super_SyntaxListBase.super_SyntaxNode.kind;
  *(undefined4 *)&(pUVar9->disabledTokens).super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar4;
  (pUVar9->disabledTokens).super_SyntaxListBase.super_SyntaxNode.parent = pSVar1;
  (pUVar9->disabledTokens).super_SyntaxListBase.super_SyntaxNode.previewNode =
       (args->disabledTokens).super_SyntaxListBase.super_SyntaxNode.previewNode;
  (pUVar9->disabledTokens).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_002da6d8;
  (pUVar9->disabledTokens).super_SyntaxListBase.childCount =
       (args->disabledTokens).super_SyntaxListBase.childCount;
  sVar3 = (args->disabledTokens).super_span<slang::parsing::Token,_18446744073709551615UL>._M_extent
          ._M_extent_value;
  (pUVar9->disabledTokens).super_span<slang::parsing::Token,_18446744073709551615UL>._M_ptr =
       (args->disabledTokens).super_span<slang::parsing::Token,_18446744073709551615UL>._M_ptr;
  (pUVar9->disabledTokens).super_span<slang::parsing::Token,_18446744073709551615UL>._M_extent.
  _M_extent_value = sVar3;
  (pUVar9->disabledTokens).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_002dac28;
  return pUVar9;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }